

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  basic_format_specs<wchar_t> *pbVar3;
  long lVar4;
  wchar_t wVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  string groups;
  format_specs local_f8;
  string local_c8;
  ulong local_a8;
  ulong uStack_a0;
  wchar_t local_98 [2];
  wchar_t awStack_90 [2];
  wchar_t local_88;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_78;
  
  grouping_impl<wchar_t>(&local_c8,(locale_ref)(this->writer->locale_).locale_);
  if (local_c8._M_string_length == 0) {
    on_dec(this);
    goto LAB_00183e54;
  }
  wVar5 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
  if (wVar5 == L'\0') {
    on_dec(this);
    goto LAB_00183e54;
  }
  local_78.f.abs_value = this->abs_value;
  lVar4 = 0x3f;
  if ((local_78.f.abs_value | 1) != 0) {
    for (; (local_78.f.abs_value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar6 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar7 = (uVar6 + 1) -
          (uint)(local_78.f.abs_value <
                *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar6 * 8));
  pcVar1 = local_c8._M_dataplus._M_p + local_c8._M_string_length;
  _Var10._M_p = local_c8._M_dataplus._M_p;
  uVar6 = uVar7;
  if (local_c8._M_string_length == 0) {
LAB_00183d73:
    uVar8 = uVar6;
    local_78.f.size = uVar7;
    if (_Var10._M_p == pcVar1) goto LAB_00183d7e;
  }
  else {
    local_78.f.size = uVar7 + (int)local_c8._M_string_length;
    do {
      cVar2 = *_Var10._M_p;
      uVar8 = uVar6 - (int)cVar2;
      if ((uVar8 == 0 || (int)uVar6 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00183d73;
      uVar7 = uVar7 + 1;
      _Var10._M_p = _Var10._M_p + 1;
      local_c8._M_string_length = local_c8._M_string_length - 1;
      uVar6 = uVar8;
    } while (local_c8._M_string_length != 0);
LAB_00183d7e:
    local_78.f.size = (int)(uVar8 - 1) / (int)pcVar1[-1] + local_78.f.size;
  }
  pbVar3 = this->specs;
  local_78.prefix.size_ = (size_t)this->prefix_size;
  local_78.prefix.data_ = this->prefix;
  local_f8.fill.data_[5] = (pbVar3->fill).data_[5];
  local_f8.width = pbVar3->width;
  local_f8.precision = pbVar3->precision;
  uStack_a0._0_1_ = pbVar3->type;
  uStack_a0._1_3_ = *(undefined3 *)&pbVar3->field_0x9;
  uStack_a0._4_4_ = (pbVar3->fill).data_[0];
  local_f8.fill.data_._4_8_ = *(undefined8 *)((pbVar3->fill).data_ + 1);
  local_f8.fill.data_._12_8_ = *(undefined8 *)((pbVar3->fill).data_ + 3);
  uVar11 = (uint)local_78.f.size + local_78.prefix.size_;
  local_f8._9_1_ = SUB31(uStack_a0._1_3_,0);
  local_78.fill = uStack_a0._4_4_;
  local_f8._8_8_ = uStack_a0;
  if ((local_f8._9_1_ & 0xf) == 4) {
    uVar9 = local_f8._0_8_ & 0xffffffff;
    local_78.size_ = uVar11;
    local_78.padding = 0;
    if (uVar11 <= uVar9) {
      local_78.size_ = uVar9;
      local_78.padding = uVar9 - uVar11;
    }
  }
  else {
    local_78.padding = 0;
    uVar6 = local_f8.precision - local_78.f.size;
    if (uVar6 != 0 && local_78.f.size <= (int)local_f8.precision) {
      local_78.fill = L'0';
    }
    if (uVar6 != 0 && local_78.f.size <= (int)local_f8.precision) {
      uVar11 = (uint)local_f8.precision + local_78.prefix.size_;
      local_78.padding = (ulong)uVar6;
    }
    local_78.size_ = uVar11;
    if ((uStack_a0 & 0xf00) == 0) {
      local_f8._8_8_ = uStack_a0 | 0x200;
    }
  }
  local_a8 = local_f8._0_8_;
  local_98 = (wchar_t  [2])local_f8.fill.data_._4_8_;
  awStack_90 = (wchar_t  [2])local_f8.fill.data_._12_8_;
  local_88 = local_f8.fill.data_[5];
  local_78.f.groups = &local_c8;
  local_78.f.sep = wVar5;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_f8,&local_78);
LAB_00183e54:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }